

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMConnection CMinternal_get_conn(CManager_conflict cm,attr_list attrs)

{
  CMConnection_conflict p_Var1;
  FILE *pFVar2;
  bool bVar3;
  int iVar4;
  __pid_t _Var5;
  CMConnection_conflict conn;
  pthread_t pVar6;
  long lVar7;
  timespec ts;
  int target_cm_id;
  timespec local_48;
  int local_34;
  
  iVar4 = CManager_locked(cm);
  if (iVar4 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                  ,0x6a3,"CMConnection CMinternal_get_conn(CManager, attr_list)");
  }
  iVar4 = CMtrace_val[2];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar4 = CMtrace_init(cm,CMConnectionVerbose);
  }
  if (iVar4 != 0) {
    fwrite("In CMinternal_get_conn, attrs ",0x1e,1,(FILE *)cm->CMTrace_file);
    if (attrs == (attr_list)0x0) {
      fputc(10,(FILE *)cm->CMTrace_file);
    }
    else {
      fdump_attr_list((FILE *)cm->CMTrace_file,attrs);
    }
  }
  local_34 = -1;
  get_int_attr(attrs,CM_CMANAGER_ID);
  if (cm->connection_count < 1) {
    conn = (CMConnection_conflict)0x0;
  }
  else {
    lVar7 = 0;
    conn = (CMConnection_conflict)0x0;
    do {
      p_Var1 = cm->connections[lVar7];
      if (((p_Var1->closed == 0) && (p_Var1->failed == 0)) &&
         ((p_Var1->remote_CManager_ID == local_34 ||
          (iVar4 = (*p_Var1->trans->connection_eq)
                             (cm,&CMstatic_trans_svcs,p_Var1->trans,attrs,p_Var1->transport_data),
          iVar4 != 0)))) {
        iVar4 = CMtrace_val[7];
        if (p_Var1->cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(p_Var1->cm,CMFreeVerbose);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar2 = (FILE *)p_Var1->cm->CMTrace_file;
            _Var5 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_48);
            fprintf((FILE *)p_Var1->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,
                    local_48.tv_nsec);
          }
          fprintf((FILE *)p_Var1->cm->CMTrace_file,
                  "internal_get_conn found conn=%p ref count will be %d\n",p_Var1,
                  (ulong)(p_Var1->conn_ref_count + 1));
        }
        fflush((FILE *)p_Var1->cm->CMTrace_file);
        iVar4 = CMtrace_val[2];
        if (p_Var1->cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(p_Var1->cm,CMConnectionVerbose);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar2 = (FILE *)p_Var1->cm->CMTrace_file;
            _Var5 = getpid();
            pVar6 = pthread_self();
            fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_48);
            fprintf((FILE *)p_Var1->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,
                    local_48.tv_nsec);
          }
          fprintf((FILE *)p_Var1->cm->CMTrace_file,
                  "internal_get_conn found conn=%p ref count will be %d\n",p_Var1,
                  (ulong)(p_Var1->conn_ref_count + 1));
        }
        fflush((FILE *)p_Var1->cm->CMTrace_file);
        p_Var1->conn_ref_count = p_Var1->conn_ref_count + 1;
        bVar3 = true;
        conn = p_Var1;
      }
      else {
        bVar3 = false;
      }
    } while ((!bVar3) && (lVar7 = lVar7 + 1, lVar7 < cm->connection_count));
  }
  if (conn == (CMConnection_conflict)0x0) {
    iVar4 = CMtrace_val[2];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,CMConnectionVerbose);
    }
    if (iVar4 != 0) {
      fwrite("In CMinternal_get_conn, no existing connection found, initiating\n",0x41,1,
             (FILE *)cm->CMTrace_file);
    }
    conn = CMinternal_initiate_conn(cm,attrs);
    if (conn == (CMConnection)0x0) {
      conn = (CMConnection)0x0;
    }
    else {
      iVar4 = CMtrace_val[7];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(conn->cm,CMFreeVerbose);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)conn->cm->CMTrace_file;
          _Var5 = getpid();
          pVar6 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,
                "internal_get_conn initiated connection %p ref count now %d\n",conn,
                (ulong)(uint)conn->conn_ref_count);
      }
      fflush((FILE *)conn->cm->CMTrace_file);
    }
  }
  if (conn != (CMConnection)0x0) {
    iVar4 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)conn->cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"internal_get_conn returning conn=%p ref count %d\n",
              conn,(ulong)(uint)conn->conn_ref_count);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
  }
  iVar4 = CMtrace_val[2];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar4 = CMtrace_init(cm,CMConnectionVerbose);
  }
  if (iVar4 != 0) {
    fwrite("CMinternal_get_conn returning ",0x1e,1,(FILE *)cm->CMTrace_file);
    if (conn == (CMConnection)0x0) {
      fwrite("NULL\n",5,1,(FILE *)cm->CMTrace_file);
    }
    else {
      fdump_CMConnection(cm->CMTrace_file,conn);
    }
  }
  return conn;
}

Assistant:

CMConnection
 CMinternal_get_conn(CManager cm, attr_list attrs)
 {
     int i;
     CMConnection conn = NULL;
     assert(CManager_locked(cm));
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file, "In CMinternal_get_conn, attrs ");
	 if (attrs) fdump_attr_list(cm->CMTrace_file, attrs); else fprintf(cm->CMTrace_file, "\n");
     }
     int target_cm_id = -1;
     (void) get_int_attr(attrs, CM_CMANAGER_ID, &target_cm_id);
     for (i=0; i<cm->connection_count; i++) {
	 CMConnection tmp = cm->connections[i];
	 if (tmp->closed || tmp->failed) continue;

	 if ((tmp->remote_CManager_ID == target_cm_id) ||
	     tmp->trans->connection_eq(cm, &CMstatic_trans_svcs,
				       tmp->trans, attrs,
				       tmp->transport_data)) {

	     CMtrace_out(tmp->cm, CMFreeVerbose, "internal_get_conn found conn=%p ref count will be %d\n", 
			 tmp, tmp->conn_ref_count +1);
	     CMtrace_out(tmp->cm, CMConnectionVerbose, "internal_get_conn found conn=%p ref count will be %d\n", 
			 tmp, tmp->conn_ref_count +1);
	     tmp->conn_ref_count++;
	     conn = tmp;
	     break;
	 }
     }
     if (conn == NULL) {
	 if (CMtrace_on(cm, CMConnectionVerbose)) {
	     fprintf(cm->CMTrace_file, "In CMinternal_get_conn, no existing connection found, initiating\n");
	 }
	 conn = CMinternal_initiate_conn(cm, attrs);
	 if (conn) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "internal_get_conn initiated connection %p ref count now %d\n", 
			 conn, conn->conn_ref_count);
	 }
     }
     if (conn != NULL) {
	 CMtrace_out(conn->cm, CMFreeVerbose, "internal_get_conn returning conn=%p ref count %d\n", 
		     conn, conn->conn_ref_count);
     }
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file, "CMinternal_get_conn returning ");
	 if (conn != NULL) {
	     fdump_CMConnection(cm->CMTrace_file, conn);
	 } else {
	     fprintf(cm->CMTrace_file, "NULL\n");
	 }
     }
     return conn;
 }